

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matsubx.c
# Opt level: O0

MATRIX mat_submat(MATRIX A,int i,int j)

{
  MATRIX ppdVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  MATRIX S;
  int p1;
  int p;
  int m1;
  int m;
  int local_20;
  int in_stack_ffffffffffffffe4;
  int iVar2;
  int in_stack_ffffffffffffffe8;
  int iVar3;
  int in_stack_ffffffffffffffec;
  int iVar4;
  
  ppdVar1 = mat_creat(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4)
  ;
  iVar3 = 0;
  for (iVar4 = 0; iVar4 < *(int *)(in_RDI + -8); iVar4 = iVar4 + 1) {
    if (iVar4 != in_ESI) {
      local_20 = 0;
      for (iVar2 = 0; iVar2 < *(int *)(in_RDI + -4); iVar2 = iVar2 + 1) {
        if (iVar2 != in_EDX) {
          ppdVar1[iVar3][local_20] =
               *(double *)(*(long *)(in_RDI + (long)iVar4 * 8) + (long)iVar2 * 8);
          local_20 = local_20 + 1;
        }
      }
      iVar3 = iVar3 + 1;
    }
  }
  return ppdVar1;
}

Assistant:

MATRIX mat_submat( MATRIX A, int i, int j )
{
	int	m, m1, p, p1;
	MATRIX	S;

	S = mat_creat(MatRow(A)-1, MatCol(A)-1, UNDEFINED);

	for (m=m1=0; m<MatRow(A); m++)
		{
		if (m==i) continue;
		for (p=p1=0; p<MatCol(A); p++)
			{
			if (p==j) continue;
			S[m1][p1] = A[m][p];
			p1++;
			}
		m1++;
		}

	return (S);
}